

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O3

void __thiscall bpwriter::format_char(bpwriter *this,vm_val_t *val)

{
  wchar_t ch;
  ulong in_RAX;
  short *psVar1;
  char *pcVar2;
  CVmObjString *this_00;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  psVar1 = (short *)vm_val_t::get_as_string(val);
  if (psVar1 == (short *)0x0) {
    if (val->typ == VM_INT) {
      ch = (val->val).obj;
    }
    else {
      ch = vm_val_t::nonint_cast_to_int(val);
    }
    if (0xffff < (uint)ch) {
      err_throw(0x7e7);
    }
    this_00 = this->str;
    pcVar2 = this->dst;
  }
  else {
    if (*psVar1 == 0) {
      uStack_18 = uStack_18 & 0xffffffffffffff;
      pcVar2 = CVmObjString::cons_append(this->str,this->dst,(char *)((long)&uStack_18 + 7),1,0x40);
      goto LAB_0022a4f5;
    }
    ch = utf8_ptr::s_getch((char *)(psVar1 + 1));
    this_00 = this->str;
    pcVar2 = this->dst;
  }
  pcVar2 = CVmObjString::cons_append(this_00,pcVar2,ch,0x40);
LAB_0022a4f5:
  this->dst = pcVar2;
  return;
}

Assistant:

void format_char(VMG_ const vm_val_t *val)
    {
        /* check what we have */
        const char *str = val->get_as_string(vmg0_);
        if (str != 0)
        {
            /* it's a string - show the first character */
            size_t len = vmb_get_len(str);
            str += VMB_LEN;
            if (len != 0)
            {
                /* write the first character */
                putwch(utf8_ptr::s_getch(str));
            }
            else
            {
                /* empty string - write a null character */
                putch((char)0);
            }
        }
        else
        {
            /* it's not a string - get the integer value */
            int i = val->cast_to_int(vmg0_);

            /* make sure it's in range */
            if (i < 0 || i > 65535)
                err_throw(VMERR_NUM_OVERFLOW);

            /* write the character value */
            putwch((wchar_t)i);
        }
    }